

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_check_sig_hash(mbedtls_ssl_context *ssl,mbedtls_md_type_t md)

{
  mbedtls_md_type_t *local_28;
  int *cur;
  mbedtls_md_type_t md_local;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->conf->sig_hashes != (int *)0x0) {
    for (local_28 = (mbedtls_md_type_t *)ssl->conf->sig_hashes; *local_28 != MBEDTLS_MD_NONE;
        local_28 = local_28 + 1) {
      if (*local_28 == md) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

int mbedtls_ssl_check_sig_hash( const mbedtls_ssl_context *ssl,
                                mbedtls_md_type_t md )
{
    const int *cur;

    if( ssl->conf->sig_hashes == NULL )
        return( -1 );

    for( cur = ssl->conf->sig_hashes; *cur != MBEDTLS_MD_NONE; cur++ )
        if( *cur == (int) md )
            return( 0 );

    return( -1 );
}